

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleinterp.cpp
# Opt level: O1

void __thiscall
BrainFuckInterpreter::BrainFuckInterpreter(BrainFuckInterpreter *this,BrainFuckProgram *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  uint8_t *puVar5;
  
  paVar1 = &(this->p_).program.field_2;
  (this->p_).program._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (p->program)._M_dataplus._M_p;
  paVar2 = &(p->program).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(p->program).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->p_).program.field_2 + 8) = uVar4;
  }
  else {
    (this->p_).program._M_dataplus._M_p = pcVar3;
    (this->p_).program.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->p_).program._M_string_length = (p->program)._M_string_length;
  (p->program)._M_dataplus._M_p = (pointer)paVar2;
  (p->program)._M_string_length = 0;
  (p->program).field_2._M_local_buf[0] = '\0';
  puVar5 = (uint8_t *)operator_new__(30000);
  this->tape_ = puVar5;
  this->dc_ = 0;
  this->pc_ = 0;
  return;
}

Assistant:

explicit BrainFuckInterpreter(BrainFuckProgram p) : p_(std::move(p)), tape_(new uint8_t[TAPE_SIZE]), pc_(0), dc_(0) {
    }